

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_METAL_start(Context *ctx,char *profilestr)

{
  int iVar1;
  char *pcVar2;
  char *profilestr_local;
  Context *ctx_local;
  
  iVar1 = shader_is_vertex(ctx);
  if ((iVar1 == 0) && (iVar1 = shader_is_pixel(ctx), iVar1 == 0)) {
    failf(ctx,"Shader type %u unsupported in this profile.",(ulong)ctx->shader_type);
  }
  else {
    if (ctx->mainfn == (char *)0x0) {
      iVar1 = shader_is_vertex(ctx);
      if (iVar1 == 0) {
        iVar1 = shader_is_pixel(ctx);
        if (iVar1 != 0) {
          pcVar2 = StrDup(ctx,"FragmentShader");
          ctx->mainfn = pcVar2;
        }
      }
      else {
        pcVar2 = StrDup(ctx,"VertexShader");
        ctx->mainfn = pcVar2;
      }
    }
    set_output(ctx,&ctx->mainline);
    ctx->indent = ctx->indent + 1;
  }
  return;
}

Assistant:

static void emit_METAL_start(Context *ctx, const char *profilestr)
{
    if (!shader_is_vertex(ctx) && !shader_is_pixel(ctx))
    {
        failf(ctx, "Shader type %u unsupported in this profile.",
              (uint) ctx->shader_type);
        return;
    } // if

    if (!ctx->mainfn)
    {
        if (shader_is_vertex(ctx))
            ctx->mainfn = StrDup(ctx, "VertexShader");
        else if (shader_is_pixel(ctx))
            ctx->mainfn = StrDup(ctx, "FragmentShader");
    } // if

    set_output(ctx, &ctx->mainline);
    ctx->indent++;
}